

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disk.cpp
# Opt level: O0

uint8_t __thiscall Amiga::Chipset::DiskController::get_rdy_trk0_wpro_chng(DiskController *this)

{
  bool bVar1;
  Drive *this_00;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint local_4c;
  uint local_44;
  uint local_3c;
  uint local_34;
  uint8_t active_high;
  Drive *drive;
  uint32_t combined_id;
  DiskController *this_local;
  
  if ((this->previous_select_ & 0x40) == 0) {
    local_34 = *(uint *)&this->field_0x250;
  }
  else {
    local_34 = 0;
  }
  if ((this->previous_select_ & 0x20) == 0) {
    local_3c = *(uint *)&this->field_0x24c;
  }
  else {
    local_3c = 0;
  }
  if ((this->previous_select_ & 0x10) == 0) {
    local_44 = *(uint *)&this->field_0x248;
  }
  else {
    local_44 = 0;
  }
  if ((this->previous_select_ & 8) == 0) {
    local_4c = *(uint *)&(this->super_Controller).field_0x244;
  }
  else {
    local_4c = 0;
  }
  this_00 = Storage::Disk::Controller::get_drive(&this->super_Controller);
  bVar1 = Storage::Disk::Drive::get_motor_on(this_00);
  bVar2 = 0;
  if (bVar1) {
    bVar2 = 0x20;
  }
  bVar1 = Storage::Disk::Drive::get_is_ready(this_00);
  bVar3 = 4;
  if (bVar1) {
    bVar3 = 0;
  }
  bVar1 = Storage::Disk::Drive::get_is_track_zero(this_00);
  bVar4 = 0;
  if (bVar1) {
    bVar4 = 0x10;
  }
  bVar1 = Storage::Disk::Drive::get_is_read_only(this_00);
  bVar5 = 0;
  if (bVar1) {
    bVar5 = 8;
  }
  return ((byte)(((local_34 | local_3c | local_44 | local_4c) & 0x8000) >> 10) | bVar2 | bVar3 |
          bVar4 | bVar5) ^ 0xff;
}

Assistant:

uint8_t Chipset::DiskController::get_rdy_trk0_wpro_chng() {
	//	b5:	/RDY
	//	b4:	/TRK0
	//	b3:	/WPRO
	//	b2:	/CHNG

	// My interpretation:
	//
	//	RDY isn't RDY, it's a shift value as described above, combined with the motor state.
	//	CHNG is what is normally RDY.

	const uint32_t combined_id =
		((previous_select_ & 0x40) ? 0 : drive_ids_[3]) |
		((previous_select_ & 0x20) ? 0 : drive_ids_[2]) |
		((previous_select_ & 0x10) ? 0 : drive_ids_[1]) |
		((previous_select_ & 0x08) ? 0 : drive_ids_[0]);

	auto &drive = get_drive();
	const uint8_t active_high =
		((combined_id & 0x8000) >> 10) |
		(drive.get_motor_on() ? 0x20 : 0x00) |
		(drive.get_is_ready() ? 0x00 : 0x04) |
		(drive.get_is_track_zero() ? 0x10 : 0x00) |
		(drive.get_is_read_only() ? 0x08 : 0x00);

	return ~active_high;
}